

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* JSON::parseJSONMap(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *__return_storage_ptr__,string *json)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  int iVar3;
  pointer pcVar4;
  bool bVar5;
  mapped_type *pmVar6;
  int iVar7;
  bool bVar8;
  char *pcVar9;
  char cVar10;
  key_type *pkVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  string strKey;
  string strVal;
  key_type local_70;
  key_type local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (*(json->_M_dataplus)._M_p == '{') {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    iVar3 = (int)json->_M_string_length;
    if (1 < iVar3) {
      bVar8 = false;
      uVar14 = 1;
      bVar5 = false;
      do {
        iVar12 = (int)uVar14;
        pcVar4 = (json->_M_dataplus)._M_p;
        if (bVar8) {
          if ((pcVar4[iVar12] == '\"') && (pcVar4[(long)iVar12 + -1] != '\\')) {
            if (bVar5) {
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](__return_storage_ptr__,&local_70);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::_M_replace
                        ((ulong)&local_70,0,(char *)local_70._M_string_length,0x166c15);
              bVar5 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)&local_50,0,(char *)local_50._M_string_length,0x166c15);
              bVar8 = false;
            }
            else {
              iVar7 = iVar12 + 1;
              pcVar9 = pcVar4 + iVar12;
              do {
                pcVar9 = pcVar9 + 1;
                iVar7 = iVar7 + 1;
              } while (*pcVar9 == ' ');
              for (uVar14 = (ulong)iVar7; cVar2 = pcVar4[uVar14], cVar2 == ' '; uVar14 = uVar14 + 1)
              {
              }
              if (cVar2 == '\"') {
                bVar5 = true;
                bVar8 = true;
              }
              else {
                cVar10 = (char)&local_50;
                if (cVar2 == '[') {
                  for (; (json->_M_dataplus)._M_p[uVar14] != ']'; uVar14 = uVar14 + 1) {
                    std::__cxx11::string::push_back(cVar10);
                  }
                  std::__cxx11::string::push_back(cVar10);
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](__return_storage_ptr__,&local_70);
                  std::__cxx11::string::_M_assign((string *)pmVar6);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_70,0,(char *)local_70._M_string_length,0x166c15);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_50,0,(char *)local_50._M_string_length,0x166c15);
                }
                else {
                  for (; (cVar2 = (json->_M_dataplus)._M_p[uVar14], cVar2 != ',' && (cVar2 != '}'));
                      uVar14 = uVar14 + 1) {
                    std::__cxx11::string::push_back(cVar10);
                  }
                  pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](__return_storage_ptr__,&local_70);
                  std::__cxx11::string::_M_assign((string *)pmVar6);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_70,0,(char *)local_70._M_string_length,0x166c15);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_50,0,(char *)local_50._M_string_length,0x166c15);
                }
                bVar5 = false;
                bVar8 = false;
              }
            }
          }
          else {
            pkVar11 = &local_50;
            if (!bVar5) {
              pkVar11 = &local_70;
            }
            std::__cxx11::string::push_back((char)pkVar11);
          }
        }
        else if ((pcVar4[iVar12] == '\"') && (pcVar4[(long)iVar12 + -1] != '\\')) {
          bVar8 = true;
        }
        uVar13 = (int)uVar14 + 1;
        uVar14 = (ulong)uVar13;
      } while ((int)uVar13 < iVar3);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> parseJSONMap(const std::string & json) {
    std::map<std::string, std::string> res;
    if (json[0] != '{') return res;

    bool hasKey = false;
    bool inToken = false;

    std::string strKey = "";
    std::string strVal = "";

    int n = json.size();
    for (int i = 1; i < n; ++i) {
        if (!inToken) {
            if (json[i] == ' ') continue;
            if (json[i] == '"' && json[i-1] != '\\') {
                inToken = true;
                continue;
            }
        } else {
            if (json[i] == '"' && json[i-1] != '\\') {
                if (hasKey == false) {
                    hasKey = true;
                    ++i;
                    while (json[i] == ' ') ++i;
                    ++i; // :
                    while (json[i] == ' ') ++i;
                    if (json[i] == '[') {
                        while (json[i] != ']') {
                            strVal += json[i++];
                        }
                        strVal += ']';
                        hasKey = false;
                        res[strKey] = strVal;
                        strKey = "";
                        strVal = "";
                    } else if (json[i] != '\"') {
                        while (json[i] != ',' && json[i] != '}') {
                            strVal += json[i++];
                        }
                        hasKey = false;
                        res[strKey] = strVal;
                        strKey = "";
                        strVal = "";
                    } else {
                        inToken = true;
                        continue;
                    }
                } else {
                    hasKey = false;
                    res[strKey] = strVal;
                    strKey = "";
                    strVal = "";
                }
                inToken = false;
                continue;
            }
            if (hasKey == false) {
                strKey += json[i];
            } else {
                strVal += json[i];
            }
        }
    }

    return res;
}